

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_negx_8_d(void)

{
  uint *puVar1;
  uint res;
  uint *r_dst;
  
  puVar1 = m68ki_cpu.dar + (m68ki_cpu.ir & 7);
  m68ki_cpu.x_flag = -(m68ki_cpu.x_flag >> 8 & 1) - (*puVar1 & 0xff);
  m68ki_cpu.v_flag = *puVar1 & m68ki_cpu.x_flag;
  m68ki_cpu.not_z_flag = m68ki_cpu.x_flag & 0xff | m68ki_cpu.not_z_flag;
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  *puVar1 = *puVar1 & 0xffffff00 | m68ki_cpu.x_flag & 0xff;
  return;
}

Assistant:

static void m68k_op_negx_8_d(void)
{
	uint* r_dst = &DY;
	uint res = 0 - MASK_OUT_ABOVE_8(*r_dst) - XFLAG_AS_1();

	FLAG_N = NFLAG_8(res);
	FLAG_X = FLAG_C = CFLAG_8(res);
	FLAG_V = *r_dst & res;

	res = MASK_OUT_ABOVE_8(res);
	FLAG_Z |= res;

	*r_dst = MASK_OUT_BELOW_8(*r_dst) | res;
}